

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O3

char * __thiscall
stringsearch<std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>::
search(stringsearch<std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>
       *this,char *first,char *last,CallbackType *cb)

{
  pointer ptVar1;
  unsigned_long uVar2;
  bool bVar3;
  pointer this_00;
  char *pcVar4;
  pair<const_char_*,_const_char_*> pVar5;
  char *local_40;
  char *local_38;
  
  this_00 = (this->patterns).
            super__Vector_base<std::tuple<unsigned_long,_std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->patterns).
           super__Vector_base<std::tuple<unsigned_long,_std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != ptVar1) {
    do {
      uVar2 = (this_00->
              super__Tuple_impl<0UL,_unsigned_long,_std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>
              ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      pcVar4 = first;
      while (pcVar4 != last) {
        pVar5 = std::boyer_moore_searcher<char_const*,std::hash<char>,std::equal_to<void>>::
                operator()(this_00,pcVar4,last);
        pcVar4 = pVar5.first;
        if (pcVar4 == last) break;
        local_40 = pcVar4 + uVar2;
        local_38 = pcVar4;
        if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar3 = (*cb->_M_invoker)((_Any_data *)cb,&local_38,&local_40);
        pcVar4 = pcVar4 + 1;
        if (!bVar3) {
          return (char *)0x0;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != ptVar1);
  }
  return last;
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        for (auto& hp : patterns)
        {
            auto size = std::get<0>(hp);
            auto & searcher = std::get<1>(hp);

            auto p = first;
            while (p != last) {
                auto f = std::search(p, last, searcher);
                if (f == last)
                    break;
                if (!cb((const char*)f, (const char*)f + size))
                    return NULL;
                p = f + 1;
            }
        }
        return last;
    }